

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parseSpecifierQualifierList
          (Parser *this,DeclarationSyntax **decl,SpecifierListSyntax **specList)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar3;
  SyntaxKind SVar4;
  bool bVar5;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **specList_00;
  SyntaxKind specK;
  offset_in_Parser_to_subr in_R9;
  bool bVar6;
  SpecifierSyntax *spec;
  uint local_5c;
  SpecifierSyntax *local_38;
  
  bVar5 = false;
  local_5c = (uint)&this->diagReporter_;
  specList_00 = specList;
  do {
    local_38 = (SpecifierSyntax *)0x0;
    pSVar2 = peek(this,1);
    SVar4 = pSVar2->syntaxK_;
    bVar1 = bVar5;
    if (Keyword_sizeof < SVar4) {
      if (Keyword__Thread_local < SVar4) {
        if (Keyword_ExtGNU___thread < SVar4) {
          if (SVar4 == KeywordAlias___typeof) {
            bVar6 = parseExtGNU_Typeof_AtFirst(this,&local_38);
            goto LAB_002c13b0;
          }
          if (SVar4 != Keyword_ExtGNU___complex__) goto switchD_002c11dd_caseD_23;
switchD_002c11dd_caseD_21:
          parseTrivialSpecifier_AtFirst<psy::C::BasicTypeSpecifierSyntax>
                    (this,&local_38,BasicTypeSpecifier);
          goto LAB_002c1283;
        }
        if (SVar4 - 0x71 < 2) goto switchD_002c11dd_caseD_21;
        if (SVar4 != KeywordAlias___attribute) goto switchD_002c11dd_caseD_23;
        bVar6 = parseExtGNU_AttributeSpecifier_AtFirst(this,&local_38);
LAB_002c13b0:
        if (bVar6 != false) goto LAB_002c13c9;
        goto LAB_002c1411;
      }
      if (SVar4 - 0x66 < 3) goto switchD_002c11dd_caseD_21;
      if (SVar4 == KeywordAlias___alignas) {
        bVar6 = parseAlignmentSpecifier_AtFirst(this,&local_38);
        goto LAB_002c13b0;
      }
      if (SVar4 != Keyword__Atomic) goto switchD_002c11dd_caseD_23;
      pSVar2 = peek(this,2);
      if (pSVar2->syntaxK_ != OpenParenToken) {
        SVar4 = AtomicQualifier;
        goto LAB_002c13c1;
      }
      bVar6 = parseAtomicTypeSpecifier_AtFirst(this,&local_38);
      bVar1 = true;
      if (!bVar6) goto LAB_002c1411;
      goto LAB_002c13c9;
    }
    switch(SVar4) {
    case Keyword_char:
    case Keyword_double:
    case Keyword_float:
    case Keyword_int:
    case Keyword_long:
    case Keyword_short:
    case KeywordAlias___signed:
    case Keyword_unsigned:
      goto switchD_002c11dd_caseD_21;
    case KeywordAlias___const:
      SVar4 = ConstQualifier;
      break;
    case Keyword_continue:
    case Keyword_default:
    case Keyword_do:
    case Keyword_else:
    case Keyword_extern:
    case Keyword_for:
    case Keyword_goto:
    case Keyword_if:
    case KeywordAlias___inline:
    case Keyword_register:
    case Keyword_return:
    case Keyword_static:
    case Keyword_switch:
    case Keyword_typedef:
switchD_002c11dd_caseD_23:
      if (specList_00 == specList) {
        DiagnosticsReporter::ExpectedFIRSTofSpecifierQualifier(&this->diagReporter_);
        goto LAB_002c1411;
      }
      goto LAB_002c12ad;
    case Keyword_enum:
      bVar1 = parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>
                        (this,decl,&local_38,EnumDeclaration,EnumTypeSpecifier,in_R9);
      goto LAB_002c138c;
    case KeywordAlias___restrict:
      SVar4 = RestrictQualifier;
      break;
    case Keyword_struct:
      SVar4 = StructDeclaration;
      specK = StructTypeSpecifier;
      goto LAB_002c1387;
    case Keyword_union:
      SVar4 = UnionDeclaration;
      specK = UnionTypeSpecifier;
LAB_002c1387:
      bVar1 = parseTagTypeSpecifier_AtFirst<psy::C::StructOrUnionDeclarationSyntax>
                        (this,decl,&local_38,SVar4,specK,in_R9);
LAB_002c138c:
      bVar5 = true;
      if (bVar1 == false) {
LAB_002c1411:
        local_5c = 0;
        goto LAB_002c1419;
      }
LAB_002c1283:
      bVar1 = true;
      goto LAB_002c13c9;
    case Keyword_void:
      parseTrivialSpecifier_AtFirst<psy::C::VoidTypeSpecifierSyntax>(this,&local_38);
      goto LAB_002c1283;
    case ENDof_KeywordOrPunctuatorToken:
      SVar4 = VolatileQualifier;
      break;
    default:
      if (SVar4 != IdentifierToken) goto switchD_002c11dd_caseD_23;
      if (!bVar5) {
        parseTypedefName_AtFirst(this,&local_38);
        goto LAB_002c1283;
      }
LAB_002c12ad:
      local_5c = 1;
LAB_002c1419:
      bVar6 = false;
      goto LAB_002c13fd;
    }
LAB_002c13c1:
    parseTrivialSpecifier_AtFirst<psy::C::TypeQualifierSyntax>(this,&local_38,SVar4);
LAB_002c13c9:
    pSVar3 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                       (this,&local_38);
    *specList_00 = pSVar3;
    specList_00 = &(pSVar3->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .next;
    bVar6 = *decl == (DeclarationSyntax *)0x0;
    bVar5 = bVar1;
    if (!bVar6) {
      bVar1 = parseTypeQualifiersAndAttributes(this,specList_00);
      local_5c = (uint)bVar1;
    }
LAB_002c13fd:
    if (!bVar6) {
      return (bool)((byte)local_5c & 1);
    }
  } while( true );
}

Assistant:

bool Parser::parseSpecifierQualifierList(DeclarationSyntax*& decl,
                                         SpecifierListSyntax*& specList)
{
    DBG_THIS_RULE();

    SpecifierListSyntax** specList_cur = &specList;
    bool seenType = false;
    while (true) {
        SpecifierSyntax* spec = nullptr;
        switch (peek().kind()) {
            // declaration-specifiers -> type-qualifier
            case SyntaxKind::Keyword_const:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::ConstQualifier);
                break;

            case SyntaxKind::Keyword_volatile:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::VolatileQualifier);
                break;

            case SyntaxKind::Keyword_restrict:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::RestrictQualifier);
                break;

            // declaration-specifiers -> type-qualifier -> `_Atomic'
            // declaration-specifiers -> type-specifier -> `_Atomic' `('
            case SyntaxKind::Keyword__Atomic:
                if (peek(2).kind() == SyntaxKind::OpenParenToken) {
                    if (!parseAtomicTypeSpecifier_AtFirst(spec))
                        return false;
                    seenType = true;
                }
                else
                    parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                                spec,
                                SyntaxKind::AtomicQualifier);
                break;

            // declaration-specifiers -> type-specifier -> void
            case SyntaxKind::Keyword_void:
                seenType = true;
                parseTrivialSpecifier_AtFirst<VoidTypeSpecifierSyntax>(spec);
                break;

            // declaration-specifiers -> type-specifier -> basic types
            case SyntaxKind::Keyword_char:
            case SyntaxKind::Keyword_short:
            case SyntaxKind::Keyword_int:
            case SyntaxKind::Keyword_long:
            case SyntaxKind::Keyword_float:
            case SyntaxKind::Keyword_double:
            case SyntaxKind::Keyword__Bool:
            case SyntaxKind::Keyword__Complex:
            case SyntaxKind::Keyword_signed:
            case SyntaxKind::Keyword_unsigned:
            case SyntaxKind::Keyword_Ext_char16_t:
            case SyntaxKind::Keyword_Ext_char32_t:
            case SyntaxKind::Keyword_Ext_wchar_t:
            case SyntaxKind::Keyword_ExtGNU___complex__:
                seenType = true;
                parseTrivialSpecifier_AtFirst<BasicTypeSpecifierSyntax>(
                            spec,
                            SyntaxKind::BasicTypeSpecifier);
                break;

            // declaration-specifiers -> type-specifier ->* `struct'
            case SyntaxKind::Keyword_struct:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<StructOrUnionDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::StructDeclaration,
                            SyntaxKind::StructTypeSpecifier,
                            &Parser::parseStructDeclaration))
                    return false;
                break;

            // declaration-specifiers -> type-specifier ->* `union'
            case SyntaxKind::Keyword_union:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<StructOrUnionDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::UnionDeclaration,
                            SyntaxKind::UnionTypeSpecifier,
                            &Parser::parseStructDeclaration))
                    return false;
                break;

            // declaration-specifiers -> type-specifier -> enum-specifier
            case SyntaxKind::Keyword_enum:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<EnumDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::EnumDeclaration,
                            SyntaxKind::EnumTypeSpecifier,
                            &Parser::parseEnumerator))
                    return false;
                break;

            // declaration-specifiers -> type-specifier -> typedef-name
            case SyntaxKind::IdentifierToken: {
                if (seenType)
                    return true;
                seenType = true;
                parseTypedefName_AtFirst(spec);
                break;
            }

            // declaration-specifiers -> alignment-specifier
            case SyntaxKind::Keyword__Alignas:
                if (!parseAlignmentSpecifier_AtFirst(spec))
                    return false;
                break;

            // declaration-specifiers -> GNU-attribute-specifier
            case SyntaxKind::Keyword_ExtGNU___attribute__:
                if (!parseExtGNU_AttributeSpecifier_AtFirst(spec))
                    return false;
                break;

            // declaration-specifiers -> GNU-typeof-specifier
            case SyntaxKind::Keyword_ExtGNU___typeof__:
                if (!parseExtGNU_Typeof_AtFirst(spec))
                    return false;
                break;

            default:
                if (specList_cur == &specList) {
                    diagReporter_.ExpectedFIRSTofSpecifierQualifier();
                    return false;
                }
                return true;
        }

        *specList_cur = makeNode<SpecifierListSyntax>(spec);
        specList_cur = &(*specList_cur)->next;

        if (decl)
            return parseTypeQualifiersAndAttributes(*specList_cur);
    }
}